

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

string * __thiscall
Json::valueToQuotedString_abi_cxx11_(string *__return_storage_ptr__,Json *this,char *value)

{
  Json JVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  Json *pJVar5;
  ostream *poVar6;
  allocator local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream oss;
  
  if (this == (Json *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&oss);
    return __return_storage_ptr__;
  }
  pcVar4 = strpbrk((char *)this,"\"\\\b\f\n\r\t");
  pJVar5 = this;
  if (pcVar4 == (char *)0x0) {
    do {
      JVar1 = *pJVar5;
      pJVar5 = pJVar5 + 1;
    } while (0x1f < (byte)JVar1);
    if (JVar1 == (Json)0x0) {
      std::__cxx11::string::string((string *)&local_1c8,"\"",&local_1c9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                     &local_1c8,(char *)this);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,"\"")
      ;
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_1c8);
      return __return_storage_ptr__;
    }
  }
  strlen((char *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  do {
    JVar1 = *this;
    switch(JVar1) {
    case (Json)0x0:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    case (Json)0x1:
    case (Json)0x2:
    case (Json)0x3:
    case (Json)0x4:
    case (Json)0x5:
    case (Json)0x6:
    case (Json)0x7:
    case (Json)0xb:
      goto switchD_0010c249_caseD_1;
    case (Json)0x8:
      break;
    case (Json)0x9:
      break;
    case (Json)0xa:
      break;
    case (Json)0xc:
      break;
    case (Json)0xd:
      break;
    default:
      if ((JVar1 == (Json)0x22) || (JVar1 == (Json)0x5c)) break;
      goto switchD_0010c249_caseD_1;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0010c334:
    this = this + 1;
  } while( true );
switchD_0010c249_caseD_1:
  if ((byte)((char)JVar1 - 1U) < 0x1f) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar6 = std::operator<<((ostream *)&oss,"\\u");
    lVar2 = *(long *)poVar6;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar6 + lVar3 + 0x18) = *(uint *)(poVar6 + lVar3 + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
    poVar6 = std::operator<<(poVar6,0x30);
    *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 4;
    std::ostream::operator<<(poVar6,(int)(char)*this);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  }
  else {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  goto LAB_0010c334;
}

Assistant:

JSONCPP_STRING valueToQuotedString(const char* value) {
  if (value == NULL)
    return "";
  // Not sure how to handle unicode...
  if (strpbrk(value, "\"\\\b\f\n\r\t") == NULL &&
      !containsControlCharacter(value))
    return JSONCPP_STRING("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to JSONCPP_STRING is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  JSONCPP_STRING::size_type maxsize =
      strlen(value) * 2 + 3; // allescaped+quotes+NULL
  JSONCPP_STRING result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  for (const char* c = value; *c != 0; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default:
      if (isControlCharacter(*c)) {
        JSONCPP_OSTRINGSTREAM oss;
        oss << "\\u" << std::hex << std::uppercase << std::setfill('0')
            << std::setw(4) << static_cast<int>(*c);
        result += oss.str();
      } else {
        result += *c;
      }
      break;
    }
  }
  result += "\"";
  return result;
}